

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O2

bool __thiscall
ON_OBSOLETE_V5_DimRadial::GetBBox
          (ON_OBSOLETE_V5_DimRadial *this,double *boxmin,double *boxmax,bool bGrowBox)

{
  ON_Plane *this_00;
  ON_2dPoint *pOVar1;
  bool bVar2;
  undefined7 in_register_00000009;
  ON_3dPointArray P;
  ON_3dPoint local_70;
  ON_BoundingBox local_58;
  
  ON_BoundingBox::ON_BoundingBox(&local_58);
  if ((int)CONCAT71(in_register_00000009,bGrowBox) == 0) {
LAB_004c306c:
    bVar2 = false;
    if ((this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_count !=
        4) {
      return false;
    }
  }
  else {
    local_58.m_min.x = *boxmin;
    local_58.m_min.y = boxmin[1];
    local_58.m_min.z = boxmin[2];
    local_58.m_max.x = *boxmax;
    local_58.m_max.y = boxmax[1];
    local_58.m_max.z = boxmax[2];
    bVar2 = ON_BoundingBox::IsValid(&local_58);
    if (!bVar2) {
      ON_BoundingBox::Destroy(&local_58);
      goto LAB_004c306c;
    }
    bVar2 = true;
    if ((this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_count !=
        4) goto LAB_004c3171;
  }
  ON_3dPointArray::ON_3dPointArray(&P,4);
  if ((this->super_ON_OBSOLETE_V5_Annotation).m_userpositionedtext == true) {
    pOVar1 = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_a;
    ON_Plane::PointAt(&local_70,&(this->super_ON_OBSOLETE_V5_Annotation).m_plane,pOVar1->x,pOVar1->y
                     );
    ON_SimpleArray<ON_3dPoint>::Append(&P.super_ON_SimpleArray<ON_3dPoint>,&local_70);
  }
  this_00 = &(this->super_ON_OBSOLETE_V5_Annotation).m_plane;
  ON_SimpleArray<ON_3dPoint>::Append(&P.super_ON_SimpleArray<ON_3dPoint>,&this_00->origin);
  pOVar1 = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_a;
  ON_Plane::PointAt(&local_70,this_00,pOVar1[1].x,pOVar1[1].y);
  ON_SimpleArray<ON_3dPoint>::Append(&P.super_ON_SimpleArray<ON_3dPoint>,&local_70);
  pOVar1 = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_a;
  ON_Plane::PointAt(&local_70,this_00,pOVar1[2].x,pOVar1[2].y);
  ON_SimpleArray<ON_3dPoint>::Append(&P.super_ON_SimpleArray<ON_3dPoint>,&local_70);
  pOVar1 = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_a;
  ON_Plane::PointAt(&local_70,this_00,pOVar1[3].x,pOVar1[3].y);
  ON_SimpleArray<ON_3dPoint>::Append(&P.super_ON_SimpleArray<ON_3dPoint>,&local_70);
  bVar2 = ON_3dPointArray::GetBBox(&P,(double *)&local_58,&local_58.m_max.x,bVar2);
  ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&P.super_ON_SimpleArray<ON_3dPoint>);
  if (!bVar2) {
    return false;
  }
LAB_004c3171:
  *boxmin = local_58.m_min.x;
  boxmin[1] = local_58.m_min.y;
  boxmin[2] = local_58.m_min.z;
  *boxmax = local_58.m_max.x;
  boxmax[1] = local_58.m_max.y;
  boxmax[2] = local_58.m_max.z;
  return true;
}

Assistant:

bool ON_OBSOLETE_V5_DimRadial::GetBBox(
        double* boxmin,
        double* boxmax,
        bool bGrowBox
        ) const
{
  ON_BoundingBox bbox;
  if ( bGrowBox )
  {
    bbox.m_min.x = boxmin[0]; 
    bbox.m_min.y = boxmin[1]; 
    bbox.m_min.z = boxmin[2];
    bbox.m_max.x = boxmax[0]; 
    bbox.m_max.y = boxmax[1]; 
    bbox.m_max.z = boxmax[2];
    if ( !bbox.IsValid() )
    {
      bbox.Destroy();
      bGrowBox = false;
    }
  }

  if ( 4 == m_points.Count() )
  {
    ON_3dPointArray P(4);
    ON_2dPoint uv;
    if ( m_userpositionedtext )
    {
      uv = m_points[0]; // point someplace in text
      P.Append( m_plane.PointAt(uv.x,uv.y) );
    }

    P.Append( m_plane.origin ); // + sign at center of dimension

    uv = m_points[1];
    P.Append( m_plane.PointAt(uv.x,uv.y) );

    uv = m_points[2];
    P.Append( m_plane.PointAt(uv.x,uv.y) );

    uv = m_points[3];
    P.Append( m_plane.PointAt(uv.x,uv.y) );
    bGrowBox = P.GetBBox(&bbox.m_min.x, &bbox.m_max.x, bGrowBox);
  }

  if ( bGrowBox )
  {
    boxmin[0] = bbox.m_min.x; 
    boxmin[1] = bbox.m_min.y; 
    boxmin[2] = bbox.m_min.z; 
    boxmax[0] = bbox.m_max.x; 
    boxmax[1] = bbox.m_max.y; 
    boxmax[2] = bbox.m_max.z; 
  }

  return bGrowBox;
}